

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R.cpp
# Opt level: O0

int main(void)

{
  allocator<std::vector<long_long,_std::allocator<long_long>_>_> *this;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *this_00;
  size_type __n;
  size_type __n_00;
  longlong lVar5;
  reference pvVar6;
  reference pvVar7;
  int iVar8;
  longlong throughput;
  int down_neighbour;
  int up_neighbour;
  int left_neighbour;
  int right_neighbour;
  int current_vertex;
  int j_1;
  int i_1;
  int j;
  int i;
  char elem;
  longlong in;
  longlong out;
  Network transport;
  allocator<long_long> local_49;
  vector<long_long,_std::allocator<long_long>_> local_48;
  undefined1 local_30 [8];
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  table;
  int local_10;
  int M;
  int N;
  
  M = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  this_00 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (this_00,(int *)((long)&table.
                                    super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  __n = (size_type)local_10;
  __n_00 = (size_type)
           table.
           super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  std::allocator<long_long>::allocator(&local_49);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_48,__n_00,&local_49);
  this = (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
         ((long)&transport.g.
                 super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::allocator(this);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            *)local_30,__n,&local_48,this);
  std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>::~allocator
            ((allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)
             ((long)&transport.g.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_48);
  std::allocator<long_long>::~allocator(&local_49);
  Network::Network((Network *)&out,
                   local_10 *
                   table.
                   super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2);
  in = 0;
  _i = 0;
  for (i_1 = 0; i_1 < local_10; i_1 = i_1 + 1) {
    for (j_1 = 0; j_1 < table.
                        super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; j_1 = j_1 + 1) {
      std::operator>>((istream *)&std::cin,(char *)((long)&j + 3));
      lVar5 = valence(j._3_1_);
      pvVar6 = std::
               vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                             *)local_30,(long)i_1);
      pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pvVar6,(long)j_1);
      *pvVar7 = lVar5;
      if (j._3_1_ != '.') {
        if ((i_1 + j_1) % 2 == 0) {
          iVar8 = local_10 *
                  table.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          iVar1 = table.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * i_1;
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)i_1);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pvVar6,(long)j_1);
          Network::add_edge((Network *)&out,iVar8,iVar1 + j_1,*pvVar7);
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)i_1);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pvVar6,(long)j_1);
          in = *pvVar7 + in;
        }
        else {
          iVar1 = table.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * i_1;
          iVar8 = local_10 *
                  table.
                  super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)i_1);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pvVar6,(long)j_1);
          Network::add_edge((Network *)&out,iVar1 + j_1,iVar8 + 1,*pvVar7);
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)i_1);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[](pvVar6,(long)j_1);
          _i = *pvVar7 + _i;
        }
      }
    }
  }
  for (current_vertex = 0; current_vertex < local_10; current_vertex = current_vertex + 1) {
    for (right_neighbour = 0;
        right_neighbour <
        table.
        super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        right_neighbour = right_neighbour + 1) {
      pvVar6 = std::
               vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
               ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                             *)local_30,(long)current_vertex);
      pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (pvVar6,(long)right_neighbour);
      if ((*pvVar7 != -1) && ((current_vertex + right_neighbour) % 2 != 1)) {
        iVar1 = current_vertex *
                table.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + right_neighbour;
        iVar8 = current_vertex *
                table.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar2 = current_vertex *
                table.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar3 = (current_vertex + -1) *
                table.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar4 = (current_vertex + 1) *
                table.
                super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        if (right_neighbour + 1 <
            table.
            super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)current_vertex);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             (pvVar6,(long)(right_neighbour + 1));
          if (*pvVar7 != -1) {
            Network::add_edge((Network *)&out,iVar1,iVar8 + right_neighbour + 1,1);
          }
        }
        if (-1 < right_neighbour + -1) {
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)current_vertex);
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             (pvVar6,(long)(right_neighbour + -1));
          if (*pvVar7 != -1) {
            Network::add_edge((Network *)&out,iVar1,iVar2 + right_neighbour + -1,1);
          }
        }
        if (-1 < current_vertex + -1) {
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)(current_vertex + -1));
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             (pvVar6,(long)right_neighbour);
          if (*pvVar7 != -1) {
            Network::add_edge((Network *)&out,iVar1,iVar3 + right_neighbour,1);
          }
        }
        if (current_vertex + 1 < local_10) {
          pvVar6 = std::
                   vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                   ::operator[]((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                                 *)local_30,(long)(current_vertex + 1));
          pvVar7 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                             (pvVar6,(long)right_neighbour);
          if (*pvVar7 != -1) {
            Network::add_edge((Network *)&out,iVar1,iVar4 + right_neighbour,1);
          }
        }
      }
    }
  }
  lVar5 = Network::EdmondsKarp
                    ((Network *)&out,
                     local_10 *
                     table.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     local_10 *
                     table.
                     super__Vector_base<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1);
  if (((lVar5 == _i) && (lVar5 == in)) && (lVar5 != 0)) {
    std::operator<<((ostream *)&std::cout,"Valid");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Invalid");
  }
  M = 0;
  Network::~Network((Network *)&out);
  std::
  vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
  ::~vector((vector<std::vector<long_long,_std::allocator<long_long>_>,_std::allocator<std::vector<long_long,_std::allocator<long_long>_>_>_>
             *)local_30);
  return M;
}

Assistant:

int main(){
    int N, M;
    std::ios_base::sync_with_stdio(false);
    std::cin.tie(0);
    std::cin >> N >> M;
    std::vector<std::vector<long long> > table(N, std::vector<long long>(M));
    Network transport(N * M + 2);
    long long out = 0, in = 0;
    char elem;
    for (int i = 0; i < N; ++i) { //считываем элементы
        for (int j = 0; j < M; ++j) {
            std::cin >> elem;
            table[i][j] = valence(elem);
            if(elem == '.') {
                continue;
            }
            if((i + j) % 2 == 0) {
                transport.add_edge(N * M, M * i + j, table[i][j]);
                out += table[i][j];
            } else {
                transport.add_edge(M * i + j, N * M + 1, table[i][j]);
                in += table[i][j];
            }
        }
    }
    for (int i = 0; i < N; ++i) {
        for (int j = 0; j < M; ++j) {
            if(table[i][j] == -1 || (i + j) % 2 == 1) {
                continue;
            }
            int current_vertex = i * M + j; //текущая вершина; ниже - её соседи
            int right_neighbour = i * M + j + 1;
            int left_neighbour = i * M + j - 1;
            int up_neighbour = (i - 1) * M + j;
            int down_neighbour = (i + 1) * M + j;
            if ((j + 1) < M && table[i][j + 1] != -1) {
                transport.add_edge(current_vertex, right_neighbour, 1);
            }
            if ((j - 1) >= 0 && table[i][j - 1] != -1) {
                transport.add_edge(current_vertex, left_neighbour, 1);
            }
            if ((i - 1) >= 0 && table[i - 1][j] != -1) {
                transport.add_edge(current_vertex, up_neighbour, 1);
            }
            if ((i + 1) < N && table[i + 1][j] != -1) {
                transport.add_edge(current_vertex, down_neighbour, 1);
            }
        }
    }
    long long throughput = transport.EdmondsKarp(N * M, N * M + 1);
    if (throughput == in && throughput == out && throughput != 0){
        std::cout << "Valid";
    } else {
        std::cout << "Invalid";
    }
    return 0;
}